

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::ScaleRatioFromValueT<long_long,long_long,double>
                (ImGuiDataType data_type,longlong v,longlong v_min,longlong v_max,
                bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  long lVar1;
  longlong lVar2;
  long lVar3;
  longlong lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  double dVar9;
  
  fVar8 = 0.0;
  lVar1 = v_max - v_min;
  if (lVar1 != 0) {
    lVar4 = v_max;
    if (lVar1 != 0 && v_min <= v_max) {
      lVar4 = v_min;
    }
    lVar3 = v_max;
    if (v_max < v_min) {
      lVar3 = v_min;
    }
    if (v < lVar3) {
      lVar3 = v;
    }
    if (v < lVar4) {
      lVar3 = lVar4;
    }
    if (is_logarithmic) {
      lVar4 = v_min;
      if (v_max < v_min) {
        lVar4 = v_max;
      }
      lVar2 = v_min;
      if (v_min < v_max) {
        lVar2 = v_max;
      }
      dVar6 = (double)lVar4;
      dVar7 = (double)logarithmic_zero_epsilon;
      if (ABS(dVar6) < dVar7) {
        fVar8 = logarithmic_zero_epsilon;
        if (lVar4 < 0) {
          fVar8 = -logarithmic_zero_epsilon;
        }
        dVar6 = (double)fVar8;
      }
      dVar9 = (double)lVar2;
      if (ABS(dVar9) < dVar7) {
        fVar8 = logarithmic_zero_epsilon;
        if (lVar2 < 0) {
          fVar8 = -logarithmic_zero_epsilon;
        }
        dVar9 = (double)fVar8;
      }
      if (lVar2 < 0 && lVar4 == 0) {
        dVar6 = (double)-logarithmic_zero_epsilon;
      }
      else if (lVar4 < 0 && lVar2 == 0) {
        dVar9 = (double)-logarithmic_zero_epsilon;
      }
      dVar5 = (double)lVar3;
      fVar8 = 0.0;
      if (dVar6 < dVar5) {
        if (dVar9 <= dVar5) {
          fVar8 = 1.0;
        }
        else if (v_max * v_min < 0) {
          fVar8 = -(float)lVar4 / ((float)lVar2 - (float)lVar4);
          if (v != 0) {
            if (v < 0) {
              dVar9 = log(-dVar5 / dVar7);
              dVar6 = log(-dVar6 / dVar7);
              fVar8 = (fVar8 - zero_deadzone_halfsize) * (1.0 - (float)(dVar9 / dVar6));
            }
            else {
              dVar6 = log(dVar5 / dVar7);
              dVar7 = log(dVar9 / dVar7);
              fVar8 = fVar8 + zero_deadzone_halfsize +
                      (1.0 - (fVar8 + zero_deadzone_halfsize)) * (float)(dVar6 / dVar7);
            }
          }
        }
        else if ((v_max | v_min) < 0) {
          dVar7 = log(dVar5 / dVar9);
          dVar6 = log(dVar6 / dVar9);
          fVar8 = 1.0 - (float)(dVar7 / dVar6);
        }
        else {
          dVar7 = log(dVar5 / dVar6);
          dVar6 = log(dVar9 / dVar6);
          fVar8 = (float)(dVar7 / dVar6);
        }
      }
      if (v_max < v_min) {
        fVar8 = 1.0 - fVar8;
      }
    }
    else {
      fVar8 = (float)((double)(lVar3 - v_min) / (double)lVar1);
    }
  }
  return fVar8;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;
        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }
    else
    {
        // Linear slider
        return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
    }
}